

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

uint32_t helper_bcds_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  char cVar1;
  byte bVar2;
  undefined8 uVar3;
  _Bool _Var4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  _Bool ox_flag;
  ppc_avr_t ret;
  
  cVar1 = a->s8[8];
  iVar7 = (int)cVar1;
  ox_flag = false;
  bVar2 = b->u8[0];
  uVar3 = *(undefined8 *)(b->u8 + 8);
  ret.u8[0] = (uint8_t)*(undefined8 *)b;
  ret.u64[0]._1_7_ = (undefined7)((ulong)*(undefined8 *)b >> 8);
  ret.u8[8] = (uint8_t)uVar3;
  ret.u64[1]._1_4_ = (undefined4)((ulong)uVar3 >> 8);
  ret.u32[3]._1_2_ = (undefined2)((ulong)uVar3 >> 0x28);
  ret.u8[0xf] = (uint8_t)((ulong)uVar3 >> 0x38);
  ret.u8[0] = ret.u8[0] & 0xf0;
  _Var4 = bcd_is_valid(b);
  if (!_Var4) {
    return 1;
  }
  if (cVar1 < ' ') {
    if (cVar1 < -0x1f) {
      iVar7 = -0x1f;
    }
    else if ('\0' < cVar1) goto LAB_009deb68;
    urshift(ret.u64,ret.u64 + 1,iVar7 * -4);
    uVar8 = 0;
  }
  else {
    iVar7 = 0x1f;
LAB_009deb68:
    ulshift(ret.u64,ret.u64 + 1,iVar7 << 2,&ox_flag);
    uVar8 = (uint)ox_flag;
  }
  bVar6 = 0xd;
  if (((bVar2 & 0xf) - 0xb & 0xfd) != 0) {
    bVar6 = (ps != 0) * '\x03' | 0xc;
  }
  ret.u8[0] = ret.u8[0] & 0xf0 | bVar6;
  r->u8[0] = ret.u8[0];
  *(ulong *)((long)&(r->f128).low + 1) = CONCAT17(ret.u8[8],ret.u64[0]._1_7_);
  *(undefined4 *)(r->u8 + 9) = ret.u64[1]._1_4_;
  *(undefined2 *)(r->u8 + 0xd) = ret.u32[3]._1_2_;
  r->u8[0xf] = ret.u8[0xf];
  uVar5 = bcd_cmp_zero(r);
  return uVar5 | uVar8;
}

Assistant:

uint32_t helper_bcds(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int i = a->VsrSB(7);
    bool ox_flag = false;
    int sgnb = bcd_get_sgn(b);
    ppc_avr_t ret = *b;
    ret.VsrD(1) &= ~0xf;

    if (bcd_is_valid(b) == false) {
        return CRF_SO;
    }

    if (unlikely(i > 31)) {
        i = 31;
    } else if (unlikely(i < -31)) {
        i = -31;
    }

    if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);
    }
    bcd_put_digit(&ret, bcd_preferred_sgn(sgnb, ps), 0);

    *r = ret;

    cr = bcd_cmp_zero(r);
    if (ox_flag) {
        cr |= CRF_SO;
    }

    return cr;
}